

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avx2_gemm.h
# Opt level: O2

void intgemm::AVX2::Kernels8::QuantizeU(float *input,uint8_t *output,float quant_mult,Index size)

{
  FRegister quant_mult_00;
  float *input_00;
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  
  input_00 = (float *)output;
  for (lVar1 = (ulong)size << 2; lVar1 != 0; lVar1 = lVar1 + -0x80) {
    uVar2 = CONCAT44(quant_mult,quant_mult);
    uVar3 = CONCAT44(quant_mult,quant_mult);
    uVar4 = CONCAT44(quant_mult,quant_mult);
    uVar5 = CONCAT44(quant_mult,quant_mult);
    quant_mult_00[2] = quant_mult;
    quant_mult_00[3] = quant_mult;
    quant_mult_00[0] = quant_mult;
    quant_mult_00[1] = quant_mult;
    quant_mult_00[4] = quant_mult;
    quant_mult_00[5] = quant_mult;
    quant_mult_00[6] = quant_mult;
    quant_mult_00[7] = quant_mult;
    QuantizeTile8::ConsecutiveU((Register *)input,quant_mult_00,input_00);
    *(undefined8 *)output = uVar2;
    *(undefined8 *)(output + 8) = uVar3;
    *(undefined8 *)(output + 0x10) = uVar4;
    *(undefined8 *)(output + 0x18) = uVar5;
    input = (float *)((long)input + 0x80);
    output = output + 0x20;
  }
  return;
}

Assistant:

INTGEMM_AVX2 static void QuantizeU(const float *input, uint8_t *output, float quant_mult, Index size) {
    assert(size % 32 == 0);
    assert(reinterpret_cast<uintptr_t>(input) % 32 == 0);
    FRegister q = set1_ps<FRegister>(quant_mult);
    const float *end = input + size;
    for (; input != end; input += 32, output += 32) {
      *reinterpret_cast<__m256i*>(output) = QuantizeTile8::ConsecutiveU(q, input);
    }
  }